

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextChildElement(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlDoc *doc;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    if (cur == (xmlNodePtr)0x0) {
      doc = (xmlDoc *)ctxt->context->node;
      if (doc != (xmlDoc *)0x0) {
        xVar1 = doc->type;
        if (XML_HTML_DOCUMENT_NODE < xVar1) {
          return (xmlNodePtr)0x0;
        }
        if ((0x862U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
          p_Var3 = doc->children;
          if (p_Var3 == (_xmlNode *)0x0) {
            return (xmlNodePtr)0x0;
          }
          do {
            if (p_Var3->type == XML_ELEMENT_NODE) {
              return p_Var3;
            }
            p_Var3 = p_Var3->next;
          } while (p_Var3 != (_xmlNode *)0x0);
          return (xmlNodePtr)0x0;
        }
        if ((0x2200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
          return (xmlNodePtr)0x0;
        }
        pxVar2 = xmlDocGetRootElement(doc);
        return pxVar2;
      }
    }
    else {
      xVar1 = cur->type;
      if ((((xVar1 - XML_TEXT_NODE < 6) || (xVar1 == XML_XINCLUDE_END)) ||
          (xVar1 == XML_ELEMENT_NODE)) && (pxVar2 = cur->next, pxVar2 != (xmlNodePtr)0x0)) {
        do {
          if (pxVar2->type == XML_ELEMENT_NODE) {
            return pxVar2;
          }
          pxVar2 = pxVar2->next;
        } while (pxVar2 != (_xmlNode *)0x0);
        return (xmlNodePtr)0x0;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXPathNextChildElement(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	cur = ctxt->context->node;
	if (cur == NULL) return(NULL);
	/*
	* Get the first element child.
	*/
	switch (cur->type) {
            case XML_ELEMENT_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE: /* URGENT TODO: entify-refs as well? */
            case XML_ENTITY_NODE:
		cur = cur->children;
		if (cur != NULL) {
		    if (cur->type == XML_ELEMENT_NODE)
			return(cur);
		    do {
			cur = cur->next;
		    } while ((cur != NULL) &&
			(cur->type != XML_ELEMENT_NODE));
		    return(cur);
		}
		return(NULL);
            case XML_DOCUMENT_NODE:
            case XML_HTML_DOCUMENT_NODE:
		return(xmlDocGetRootElement((xmlDocPtr) cur));
	    default:
		return(NULL);
	}
	return(NULL);
    }
    /*
    * Get the next sibling element node.
    */
    switch (cur->type) {
	case XML_ELEMENT_NODE:
	case XML_TEXT_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_ENTITY_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	case XML_XINCLUDE_END:
	    break;
	/* case XML_DTD_NODE: */ /* URGENT TODO: DTD-node as well? */
	default:
	    return(NULL);
    }
    if (cur->next != NULL) {
	if (cur->next->type == XML_ELEMENT_NODE)
	    return(cur->next);
	cur = cur->next;
	do {
	    cur = cur->next;
	} while ((cur != NULL) && (cur->type != XML_ELEMENT_NODE));
	return(cur);
    }
    return(NULL);
}